

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O2

void __thiscall
gimage::RAWImageIO::load
          (RAWImageIO *this,ImageU16 *image,char *name,int ds,long x,long y,long w,long h)

{
  unsigned_short ***pppuVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  IOException *this_00;
  ulong uVar7;
  long lVar8;
  long k;
  long lVar9;
  long lVar10;
  long i_2;
  ulong uVar11;
  long i;
  long lVar12;
  long lVar13;
  bool bVar14;
  undefined4 uStack_318;
  bool msbfirst;
  int local_314;
  ulong local_310;
  long width;
  ulong local_300;
  long height;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  int type;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  valarray<int> nline;
  valarray<int> vline;
  string filename;
  ifstream in;
  
  local_300 = CONCAT44(local_300._4_4_,ds);
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  local_2f0 = y;
  local_2e8 = x;
  iVar5 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar5 != '\0') {
    (anonymous_namespace)::readRAWHeader_abi_cxx11_
              ((string *)&in,(_anonymous_namespace_ *)name,(char *)&type,(int *)&msbfirst,
               (bool *)&width,&height,(long *)CONCAT44(local_314,uStack_318));
    std::__cxx11::string::operator=((string *)&filename,(string *)&in);
    std::__cxx11::string::~string((string *)&in);
    if (type < 2) {
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in,0,0,1);
      (*(this->super_BasicImageIO)._vptr_BasicImageIO[6])
                (this,&in,name,local_300 & 0xffffffff,local_2e8,local_2f0,w,h);
      Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setImageLimited<unsigned_char>
                (image,(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in);
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in);
    }
    else {
      local_310 = 1;
      if (1 < (int)local_300) {
        local_310 = local_300 & 0xffffffff;
      }
      if (w < 0) {
        w = (long)(width + local_310 + -1) / (long)local_310;
      }
      if (h < 0) {
        h = (long)(height + local_310 + -1) / (long)local_310;
      }
      local_2e0 = h;
      Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize(image,w,h,1);
      lVar12 = image->n;
      lVar9 = -lVar12;
      if (0 < lVar12) {
        lVar9 = lVar12;
      }
      memset(image->pixel,0,lVar9 * 2);
      std::ifstream::ifstream(&in);
      std::ios::exceptions((int)&in + (int)*(undefined8 *)(_in + -0x18));
      std::ifstream::open((char *)&in,(_Ios_Openmode)filename._M_dataplus._M_p);
      if (((((int)local_300 < 2) && (local_2f0 == 0 && local_2e8 == 0)) && (w == width)) &&
         (local_2e0 == height)) {
        lVar12 = local_2e0;
        for (lVar9 = 0; lVar9 < lVar12; lVar9 = lVar9 + 1) {
          for (lVar12 = 0; lVar12 < w; lVar12 = lVar12 + 1) {
            if (msbfirst == true) {
              sVar3 = std::streambuf::sbumpc();
              bVar2 = std::streambuf::sbumpc();
              uVar4 = (ushort)bVar2 | sVar3 << 8;
            }
            else {
              uVar4 = std::streambuf::sbumpc();
              sVar3 = std::streambuf::sbumpc();
              uVar4 = sVar3 << 8 | uVar4 & 0xff;
            }
            (*image->img)[lVar9][lVar12] = uVar4;
            w = width;
          }
          lVar12 = height;
        }
      }
      else {
        nline._M_size._0_4_ = 0;
        std::valarray<int>::valarray(&vline,(int *)&nline,w);
        local_314 = 0;
        local_300 = w;
        std::valarray<int>::valarray(&nline,&local_314,w);
        lVar12 = -local_2f0;
        if (-local_2f0 == 0 || 0 < local_2f0) {
          lVar12 = 0;
        }
        lVar9 = 0;
        if (0 < local_2e8) {
          lVar9 = local_2e8;
        }
        lVar9 = lVar9 * local_310;
        local_2c0 = -local_2e8;
        if (-local_2e8 == 0 || 0 < local_2e8) {
          local_2c0 = 0;
        }
        local_2c8 = (local_2e8 + local_2c0) * local_310;
        while ((lVar12 < local_2e0 && (lVar8 = (lVar12 + local_2f0) * local_310, lVar8 < height))) {
          local_314 = 0;
          local_2d0 = lVar12;
          std::valarray<int>::operator=(&vline,&local_314);
          local_314 = 0;
          std::valarray<int>::operator=(&nline,&local_314);
          for (uVar7 = 0; (uVar7 != local_310 && (lVar12 = lVar8 + uVar7, lVar12 < height));
              uVar7 = uVar7 + 1) {
            std::istream::seekg(&in,(width * lVar12 + lVar9) * 2,0);
            lVar12 = local_2c8;
            for (lVar13 = local_2c0;
                (lVar13 < (long)local_300 &&
                (lVar10 = lVar12, uVar11 = local_310,
                (long)((local_2e8 + lVar13) * local_310) < width)); lVar13 = lVar13 + 1) {
              for (; (bVar14 = uVar11 != 0, uVar11 = uVar11 - 1, bVar14 && (lVar10 < width));
                  lVar10 = lVar10 + 1) {
                if (msbfirst == true) {
                  iVar5 = std::streambuf::sbumpc();
                  bVar2 = std::streambuf::sbumpc();
                  uVar6 = (uint)bVar2 | iVar5 << 8;
                }
                else {
                  uVar6 = std::streambuf::sbumpc();
                  iVar5 = std::streambuf::sbumpc();
                  uVar6 = iVar5 << 8 | uVar6 & 0xff;
                }
                vline._M_data[lVar13] = vline._M_data[lVar13] + (uVar6 & 0xffff);
                nline._M_data[lVar13] = nline._M_data[lVar13] + 1;
              }
              lVar12 = lVar12 + local_310;
            }
          }
          pppuVar1 = image->img;
          lVar8 = local_2c0;
          for (lVar12 = local_2c8; (lVar8 < (long)local_300 && (lVar12 < width));
              lVar12 = lVar12 + local_310) {
            if (0 < nline._M_data[lVar8]) {
              (*pppuVar1)[local_2d0][lVar8] =
                   (ushort)(vline._M_data[lVar8] / nline._M_data[lVar8]) & 0xff;
            }
            lVar8 = lVar8 + 1;
          }
          lVar12 = local_2d0 + 1;
        }
        operator_delete(nline._M_data);
        operator_delete(vline._M_data);
      }
      std::ifstream::close();
      std::ifstream::~ifstream(&in);
    }
    std::__cxx11::string::~string((string *)&filename);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&nline,name,(allocator *)&local_314);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                 "Can only load RAW image (",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,")");
  gutil::IOException::IOException(this_00,(string *)&in);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void RAWImageIO::load(ImageU16 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  std::string filename;
  long   width, height;
  int    type;
  bool   msbfirst;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load RAW image ("+std::string(name)+")");
  }

  filename=readRAWHeader(name, type, msbfirst, width, height);

  if (type > 1)
  {
    ds=std::max(1, ds);

    if (w < 0)
    {
      w=(width+ds-1)/ds;
    }

    if (h < 0)
    {
      h=(height+ds-1)/ds;
    }

    image.setSize(w, h, 1);
    image.clear();

    try
    {
      std::ifstream in;
      in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
      in.open(filename.c_str(), std::ios::binary);

      // load downscaled part?

      if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
      {
        std::valarray<ImageU8::work_t> vline(0, w);
        std::valarray<int> nline(0, w);

        for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
        {
          // load downscaled line

          vline=0;
          nline=0;

          for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
          {
            in.seekg(static_cast<std::streamoff>((y+k)*ds+kk)*width*2+
                     static_cast<std::streamoff>(std::max(0l, x))*ds*2);

            std::streambuf *sb=in.rdbuf();

            long j=std::max(0l, -x);

            for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
            {
              for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
              {
                ImageU16::store_t v;

                if (msbfirst)
                {
                  v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
                  v=(v<<8)|(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
                }
                else
                {
                  v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
                  v=v|((static_cast<ImageU16::store_t>(sb->sbumpc())&0xff)<<8);
                }

                if (image.isValidS(v))
                {
                  vline[j]+=v;
                  nline[j]++;
                }
              }

              j++;
            }
          }

          // store line into image

          long j=std::max(0l, -x);

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            if (nline[j] > 0)
            {
              image.set(i, k, 0, static_cast<ImageU8::store_t>(vline[j]/nline[j]));
            }

            j++;
          }
        }
      }
      else // load whole image
      {
        std::streambuf *sb=in.rdbuf();

        for (long k=0; k<height; k++)
        {
          for (long i=0; i<width; i++)
          {
            ImageU16::store_t v;

            if (msbfirst)
            {
              v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
              v=(v<<8)|(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
            }
            else
            {
              v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
              v=v|((static_cast<ImageU16::store_t>(sb->sbumpc())&0xff)<<8);
            }

            image.set(i, k, 0, v);
          }
        }
      }

      in.close();
    }
    catch (const std::ios_base::failure &ex)
    {
      throw gutil::IOException(ex.what());
    }
  }
  else
  {
    ImageU8 imageu8;
    load(imageu8, name, ds, x, y, w, h);
    image.setImageLimited(imageu8);
  }
}